

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void cfd::core::ConvertFromUniValue<long>(long *value,UniValue *json_value)

{
  char *pcVar1;
  bool bVar2;
  string *psVar3;
  int64_t iVar4;
  CfdException *this;
  allocator local_f1;
  string local_f0;
  UniValue local_d0;
  UniValue json_value_copy;
  
  UniValue::UniValue(&json_value_copy,json_value);
  if (json_value_copy.typ == VSTR) {
    psVar3 = UniValue::get_str_abi_cxx11_(json_value);
    bVar2 = ::std::operator==(psVar3,"0n");
    if (bVar2) {
      ::std::__cxx11::string::string((string *)&local_f0,"0",&local_f1);
      UniValue::UniValue(&local_d0,VNUM,&local_f0);
      UniValue::operator=(&json_value_copy,&local_d0);
      UniValue::~UniValue(&local_d0);
      ::std::__cxx11::string::~string((string *)&local_f0);
    }
    else {
      pcVar1 = (psVar3->_M_dataplus)._M_p;
      bVar2 = ::std::
              all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int(*)(int)>
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(pcVar1 + (*pcVar1 == '-')),
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(pcVar1 + psVar3->_M_string_length),isdigit);
      if (bVar2) {
        psVar3 = UniValue::get_str_abi_cxx11_(json_value);
        UniValue::UniValue(&local_d0,VNUM,psVar3);
        UniValue::operator=(&json_value_copy,&local_d0);
        UniValue::~UniValue(&local_d0);
      }
    }
  }
  if (json_value_copy.typ != VNUM) {
    local_d0._0_8_ = "cfdcore_json_mapping_base.h";
    local_d0.val._M_dataplus._M_p._0_4_ = 0x100;
    local_d0.val._M_string_length = 0x528a61;
    logger::warn<>((CfdSourceLocation *)&local_d0,"Invalid json format.");
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&local_d0,"Json value convert error. Invalid json format.",
               (allocator *)&local_f0);
    CfdException::CfdException(this,kCfdOutOfRangeError,(string *)&local_d0);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar4 = UniValue::get_int64(&json_value_copy);
  *value = iVar4;
  UniValue::~UniValue(&json_value_copy);
  return;
}

Assistant:

inline void ConvertFromUniValue(
    T& value, const UniValue& json_value) {  // NOLINT
  using cfd::core::CfdError;
  using cfd::core::CfdException;
  using cfd::core::logger::warn;
  UniValue json_value_copy = json_value;
  if (json_value_copy.isStr()) {
    const auto& str = json_value.get_str();
    if (str == "0n") {
      json_value_copy = UniValue(UniValue::VNUM, "0");
    } else {
      auto begin_pos = str.begin();
      if (*begin_pos == '-') ++begin_pos;
      bool is_digits_only = std::all_of(begin_pos, str.end(), ::isdigit);
      // check max of int64 : execute call get_int64()
      if (is_digits_only) {
        json_value_copy = UniValue(UniValue::VNUM, json_value.get_str());
      }
    }
  }

  if (json_value_copy.isNum()) {
    const int64_t num = json_value_copy.get_int64();
    if (std::is_unsigned<T>::value) {
      uint64_t unsigned_num = static_cast<uint64_t>(num);
      uint64_t maximum = static_cast<uint64_t>(std::numeric_limits<T>::max());
      if ((num < 0) || (maximum < unsigned_num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    } else {
      int64_t maximum = static_cast<int64_t>(std::numeric_limits<T>::max());
      int64_t minimum = static_cast<int64_t>(std::numeric_limits<T>::min());
      if ((maximum < num) || (minimum > num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    }
    value = static_cast<T>(num);
  } else {
    warn(CFD_LOG_SOURCE, "Invalid json format.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Json value convert error. Invalid json format.");
  }
}